

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly2_rshift1(poly2 *p)

{
  ulong uVar1;
  crypto_word_t next_carry;
  size_t i;
  crypto_word_t carry;
  poly2 *p_local;
  
  i = 0;
  for (next_carry = 10; next_carry < 0xb; next_carry = next_carry - 1) {
    uVar1 = p->v[next_carry];
    p->v[next_carry] = p->v[next_carry] >> 1;
    p->v[next_carry] = i << 0x3f | p->v[next_carry];
    i = uVar1 & 1;
  }
  return;
}

Assistant:

static void poly2_rshift1(struct poly2 *p) {
  crypto_word_t carry = 0;
  for (size_t i = WORDS_PER_POLY - 1; i < WORDS_PER_POLY; i--) {
    const crypto_word_t next_carry = p->v[i] & 1;
    p->v[i] >>= 1;
    p->v[i] |= carry << (BITS_PER_WORD - 1);
    carry = next_carry;
  }
}